

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpHeader.cpp
# Opt level: O2

char * __thiscall HttpFieldMap::getFieldTypeString(HttpFieldMap *this,FieldType type)

{
  if (type - 1000U < 0x2f) {
    return gFieldTypeList[type - 1000U];
  }
  return (char *)0x0;
}

Assistant:

const char * HttpFieldMap::getFieldTypeString(FieldType type) const
{
	TRACE_BEGIN(LOG_LVL_NOISE);
	
	if (type >= FieldMap::kHttpFieldMapStart and type < kNumFields)
	{
		type -= FieldMap::kHttpFieldMapStart;
		
		LOG("type %d, name %s",
				   type, gFieldTypeList[type]);
		
		return gFieldTypeList[type];
	}
	return NULL;
}